

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::fixloop(Fl_Graphics_Driver *this)

{
  bool bVar1;
  Fl_Graphics_Driver *this_local;
  
  while( true ) {
    bVar1 = false;
    if (2 < this->n) {
      bVar1 = false;
      if (this->p[this->n + -1].x == this->p->x) {
        bVar1 = this->p[this->n + -1].y == this->p->y;
      }
    }
    if (!bVar1) break;
    this->n = this->n + -1;
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::fixloop() {  // remove equal points from closed path
  while (n>2 && p[n-1].x == p[0].x && p[n-1].y == p[0].y) n--;
}